

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O0

char16 __thiscall TTD::UtilSupport::TTAutoString::GetCharAt(TTAutoString *this,int32 pos)

{
  bool bVar1;
  int32 iVar2;
  int32 pos_local;
  TTAutoString *this_local;
  
  bVar1 = IsNullString(this);
  if (bVar1) {
    TTDAbort_unrecoverable_error("That doesn\'t make sense.");
  }
  if (-1 < pos) {
    iVar2 = GetLength(this);
    if (pos < iVar2) {
      return this->m_contents[pos];
    }
  }
  TTDAbort_unrecoverable_error("Not in valid range.");
}

Assistant:

char16 TTAutoString::GetCharAt(int32 pos) const
        {
            TTDAssert(!this->IsNullString(), "That doesn't make sense.");
            TTDAssert(0 <= pos && pos < this->GetLength(), "Not in valid range.");

            return this->m_contents[pos];
        }